

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateClone
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  string *psVar2;
  FieldDescriptor *field;
  FieldGenerator *pFVar3;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  psVar2 = Descriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,"@Override\npublic $classname$ clone() {\n","classname",psVar2);
  io::Printer::Indent(printer);
  psVar2 = Descriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,
                     "$classname$ cloned;\ntry {\n  cloned = ($classname$) super.clone();\n} catch (java.lang.CloneNotSupportedException e) {\n  throw new java.lang.AssertionError(e);\n}\n"
                     ,"classname",psVar2);
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    field = Descriptor::field(this->descriptor_,local_1c);
    pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar3->_vptr_FieldGenerator[0xc])(pFVar3,printer);
    local_1c = local_1c + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return cloned;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateClone(io::Printer* printer) {
  printer->Print(
    "@Override\n"
    "public $classname$ clone() {\n",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "$classname$ cloned;\n"
    "try {\n"
    "  cloned = ($classname$) super.clone();\n"
    "} catch (java.lang.CloneNotSupportedException e) {\n"
    "  throw new java.lang.AssertionError(e);\n"
    "}\n",
    "classname", descriptor_->name());

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateFixClonedCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "  return cloned;\n"
    "}\n"
    "\n");
}